

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O1

ScanStatus * __thiscall
Oric::VideoOutput::get_scaled_scan_status(ScanStatus *__return_storage_ptr__,VideoOutput *this)

{
  ScanStatus local_38;
  
  Outputs::CRT::CRT::get_scaled_scan_status(&local_38,&this->crt_);
  __return_storage_ptr__->field_duration = local_38.field_duration / 6.0;
  __return_storage_ptr__->field_duration_gradient = local_38.field_duration_gradient / 6.0;
  __return_storage_ptr__->retrace_duration = local_38.retrace_duration / 6.0;
  __return_storage_ptr__->current_position = local_38.current_position;
  __return_storage_ptr__->hsync_count = local_38.hsync_count;
  __return_storage_ptr__->is_in_retrace = local_38.is_in_retrace;
  return __return_storage_ptr__;
}

Assistant:

Outputs::Display::ScanStatus VideoOutput::get_scaled_scan_status() const {
	return crt_.get_scaled_scan_status() / 6.0f;
}